

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx::SubdivPatch1IntersectorK<4>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray,
              TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  RTCFilterFunctionN p_Var7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  byte bVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  uint uVar63;
  ulong uVar64;
  long lVar65;
  ulong uVar66;
  ulong uVar67;
  GridSOA *pGVar68;
  ulong uVar69;
  char *pcVar70;
  Geometry *pGVar71;
  ulong *puVar72;
  ulong uVar73;
  ulong uVar74;
  float fVar75;
  float fVar83;
  float fVar84;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 auVar80 [32];
  float fVar85;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  float fVar92;
  float fVar93;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  undefined1 auVar91 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar107 [16];
  undefined1 auVar106 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar126;
  float fVar127;
  undefined1 auVar116 [16];
  float fVar128;
  undefined1 auVar117 [16];
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar119 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  float fVar145;
  float fVar146;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar147 [32];
  float fVar155;
  float fVar156;
  float fVar162;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar159 [32];
  float fVar163;
  undefined1 auVar161 [32];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  undefined1 auVar174 [32];
  float fVar193;
  float fVar195;
  float fVar196;
  undefined1 auVar194 [16];
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  undefined1 auVar203 [16];
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  RTCFilterFunctionNArguments args;
  float old_t;
  NodeRef stack [244];
  ulong *local_d40;
  char *local_c58;
  ulong local_c50;
  ulong local_c48;
  undefined1 local_c40 [32];
  undefined1 local_c20 [32];
  undefined1 local_c00 [16];
  undefined1 (*local_bf0) [16];
  ulong local_be8;
  undefined1 local_be0 [16];
  undefined1 auStack_bd0 [16];
  undefined1 local_bc0 [16];
  undefined1 auStack_bb0 [16];
  RTCFilterFunctionNArguments local_b90;
  Geometry *local_b60;
  undefined1 auStack_b58 [24];
  undefined1 local_b40 [32];
  undefined4 local_b10;
  undefined4 uStack_b0c;
  undefined4 uStack_b08;
  undefined4 uStack_b04;
  undefined1 local_b00 [16];
  undefined1 local_af0 [16];
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  undefined1 local_ad0 [16];
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined1 local_ab0 [16];
  uint local_aa0;
  uint uStack_a9c;
  uint uStack_a98;
  uint uStack_a94;
  uint uStack_a90;
  uint uStack_a8c;
  uint uStack_a88;
  uint uStack_a84;
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  char **local_900;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  float local_8a0 [4];
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  size_t local_800;
  ulong local_7f8 [249];
  undefined1 auVar118 [24];
  undefined1 auVar120 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [24];
  undefined1 auVar160 [32];
  
  local_800 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar116._4_4_ = uVar1;
  auVar116._0_4_ = uVar1;
  auVar116._8_4_ = uVar1;
  auVar116._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar132._4_4_ = uVar1;
  auVar132._0_4_ = uVar1;
  auVar132._8_4_ = uVar1;
  auVar132._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar135._4_4_ = uVar1;
  auVar135._0_4_ = uVar1;
  auVar135._8_4_ = uVar1;
  auVar135._12_4_ = uVar1;
  fVar75 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar83 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar84 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar109 = ZEXT416((uint)(fVar75 * 0.99999964));
  auVar109 = vshufps_avx(auVar109,auVar109,0);
  auVar110 = ZEXT416((uint)(fVar83 * 0.99999964));
  auVar110 = vshufps_avx(auVar110,auVar110,0);
  auVar106 = ZEXT416((uint)(fVar84 * 0.99999964));
  auVar106 = vshufps_avx(auVar106,auVar106,0);
  auVar76 = ZEXT416((uint)(fVar75 * 1.0000004));
  auVar76 = vshufps_avx(auVar76,auVar76,0);
  auVar77 = ZEXT416((uint)(fVar83 * 1.0000004));
  auVar77 = vshufps_avx(auVar77,auVar77,0);
  auVar78 = ZEXT416((uint)(fVar84 * 1.0000004));
  auVar78 = vshufps_avx(auVar78,auVar78,0);
  local_be8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar74 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar66 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar73 = local_be8 ^ 0x10;
  iVar2 = (tray->tnear).field_0.i[k];
  auVar194._4_4_ = iVar2;
  auVar194._0_4_ = iVar2;
  auVar194._8_4_ = iVar2;
  auVar194._12_4_ = iVar2;
  iVar2 = (tray->tfar).field_0.i[k];
  auVar203._4_4_ = iVar2;
  auVar203._0_4_ = iVar2;
  auVar203._8_4_ = iVar2;
  auVar203._12_4_ = iVar2;
  local_bf0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_d40 = local_7f8;
LAB_00f152ec:
  do {
    puVar72 = local_d40;
    if (puVar72 == &local_800) {
LAB_00f1608d:
      return puVar72 != &local_800;
    }
    local_d40 = puVar72 + -1;
    uVar67 = puVar72[-1];
    while ((uVar67 & 8) == 0) {
      auVar117 = vsubps_avx(*(undefined1 (*) [16])(uVar67 + 0x20 + local_be8),auVar116);
      auVar79._0_4_ = auVar109._0_4_ * auVar117._0_4_;
      auVar79._4_4_ = auVar109._4_4_ * auVar117._4_4_;
      auVar79._8_4_ = auVar109._8_4_ * auVar117._8_4_;
      auVar79._12_4_ = auVar109._12_4_ * auVar117._12_4_;
      auVar117 = vsubps_avx(*(undefined1 (*) [16])(uVar67 + 0x20 + uVar74),auVar132);
      auVar107._0_4_ = auVar110._0_4_ * auVar117._0_4_;
      auVar107._4_4_ = auVar110._4_4_ * auVar117._4_4_;
      auVar107._8_4_ = auVar110._8_4_ * auVar117._8_4_;
      auVar107._12_4_ = auVar110._12_4_ * auVar117._12_4_;
      auVar117 = vmaxps_avx(auVar79,auVar107);
      auVar79 = vsubps_avx(*(undefined1 (*) [16])(uVar67 + 0x20 + uVar66),auVar135);
      auVar89._0_4_ = auVar106._0_4_ * auVar79._0_4_;
      auVar89._4_4_ = auVar106._4_4_ * auVar79._4_4_;
      auVar89._8_4_ = auVar106._8_4_ * auVar79._8_4_;
      auVar89._12_4_ = auVar106._12_4_ * auVar79._12_4_;
      auVar79 = vmaxps_avx(auVar89,auVar194);
      auVar117 = vmaxps_avx(auVar117,auVar79);
      auVar79 = vsubps_avx(*(undefined1 (*) [16])(uVar67 + 0x20 + uVar73),auVar116);
      auVar136._0_4_ = auVar76._0_4_ * auVar79._0_4_;
      auVar136._4_4_ = auVar76._4_4_ * auVar79._4_4_;
      auVar136._8_4_ = auVar76._8_4_ * auVar79._8_4_;
      auVar136._12_4_ = auVar76._12_4_ * auVar79._12_4_;
      auVar79 = vsubps_avx(*(undefined1 (*) [16])(uVar67 + 0x20 + (uVar74 ^ 0x10)),auVar132);
      auVar102._0_4_ = auVar77._0_4_ * auVar79._0_4_;
      auVar102._4_4_ = auVar77._4_4_ * auVar79._4_4_;
      auVar102._8_4_ = auVar77._8_4_ * auVar79._8_4_;
      auVar102._12_4_ = auVar77._12_4_ * auVar79._12_4_;
      auVar79 = vminps_avx(auVar136,auVar102);
      auVar107 = vsubps_avx(*(undefined1 (*) [16])(uVar67 + 0x20 + (uVar66 ^ 0x10)),auVar135);
      auVar169._0_4_ = auVar78._0_4_ * auVar107._0_4_;
      auVar169._4_4_ = auVar78._4_4_ * auVar107._4_4_;
      auVar169._8_4_ = auVar78._8_4_ * auVar107._8_4_;
      auVar169._12_4_ = auVar78._12_4_ * auVar107._12_4_;
      auVar107 = vminps_avx(auVar169,auVar203);
      auVar79 = vminps_avx(auVar79,auVar107);
      auVar117 = vcmpps_avx(auVar117,auVar79,2);
      uVar63 = vmovmskps_avx(auVar117);
      if (uVar63 == 0) goto LAB_00f152ec;
      uVar63 = uVar63 & 0xff;
      uVar64 = uVar67 & 0xfffffffffffffff0;
      lVar65 = 0;
      if (uVar63 != 0) {
        for (; (uVar63 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
        }
      }
      uVar67 = *(ulong *)(uVar64 + lVar65 * 8);
      uVar63 = uVar63 - 1 & uVar63;
      uVar69 = (ulong)uVar63;
      if (uVar63 != 0) {
        do {
          *local_d40 = uVar67;
          local_d40 = local_d40 + 1;
          lVar65 = 0;
          if (uVar69 != 0) {
            for (; (uVar69 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
            }
          }
          uVar67 = *(ulong *)(uVar64 + lVar65 * 8);
          uVar69 = uVar69 - 1 & uVar69;
        } while (uVar69 != 0);
      }
    }
    if (((uint)uVar67 & 0xf) == 8) {
      pGVar68 = (pre->super_Precalculations).grid;
      uVar63 = pGVar68->width;
      local_c50 = (ulong)uVar63;
      uVar5 = pGVar68->height;
      local_c48 = (ulong)uVar5;
      uVar6 = pGVar68->gridOffset;
      uVar67 = uVar67 >> 4;
      lVar65 = uVar67 * 4 + (ulong)uVar6;
      auVar117 = *(undefined1 (*) [16])(pGVar68->data + local_c50 * 4 + lVar65 + -4);
      auVar79 = auVar117;
      if (2 < local_c48) {
        auVar79 = *(undefined1 (*) [16])
                   (pGVar68->data + local_c50 * 8 + uVar67 * 4 + (ulong)uVar6 + -4);
      }
      auVar107 = *(undefined1 (*) [16])(pGVar68->data + uVar67 * 4 + (ulong)uVar6 + -4);
      if (local_c50 == 2) {
        auVar107 = vshufps_avx(auVar107,auVar107,0x54);
        auVar117 = vshufps_avx(auVar117,auVar117,0x54);
        auVar79 = vshufps_avx(auVar79,auVar79,0x54);
      }
      uVar67 = (ulong)pGVar68->dim_offset;
      pcVar70 = pGVar68->data + uVar67 * 4 + lVar65 + -4;
      auVar89 = *(undefined1 (*) [16])(pcVar70 + local_c50 * 4);
      auVar136 = auVar89;
      if (2 < uVar5) {
        auVar136 = *(undefined1 (*) [16])(pcVar70 + local_c50 * 8);
      }
      auVar102 = *(undefined1 (*) [16])pcVar70;
      if (uVar63 == 2) {
        auVar102 = vshufps_avx(auVar102,auVar102,0x54);
        auVar89 = vshufps_avx(auVar89,auVar89,0x54);
        auVar136 = vshufps_avx(auVar136,auVar136,0x54);
      }
      pcVar70 = pGVar68->data + uVar67 * 8 + lVar65 + -4;
      auVar169 = *(undefined1 (*) [16])(pcVar70 + local_c50 * 4);
      auVar157 = auVar169;
      if (2 < uVar5) {
        auVar157 = *(undefined1 (*) [16])(pcVar70 + local_c50 * 8);
      }
      auVar140._16_16_ = auVar117;
      auVar140._0_16_ = auVar107;
      auVar80._16_16_ = auVar79;
      auVar80._0_16_ = auVar117;
      auVar30 = vunpcklps_avx(auVar140,auVar80);
      auVar140 = vshufps_avx(auVar140,auVar140,0xa5);
      auVar80 = vshufps_avx(auVar80,auVar80,0x94);
      auVar137._16_16_ = auVar89;
      auVar137._0_16_ = auVar102;
      auVar141._16_16_ = auVar136;
      auVar141._0_16_ = auVar89;
      auVar31 = vunpcklps_avx(auVar137,auVar141);
      auVar137 = vshufps_avx(auVar137,auVar137,0xa5);
      auVar141 = vshufps_avx(auVar141,auVar141,0x94);
      auVar117 = *(undefined1 (*) [16])pcVar70;
      if (uVar63 == 2) {
        auVar117 = vshufps_avx(auVar117,auVar117,0x54);
        auVar169 = vshufps_avx(auVar169,auVar169,0x54);
        auVar157 = vshufps_avx(auVar157,auVar157,0x54);
      }
      local_c58 = pGVar68->data + uVar67 * 0xc + lVar65 + -4;
      auVar142._16_16_ = auVar169;
      auVar142._0_16_ = auVar117;
      auVar119._16_16_ = auVar157;
      auVar119._0_16_ = auVar169;
      auVar32 = vunpcklps_avx(auVar142,auVar119);
      auVar26 = vshufps_avx(auVar142,auVar142,0xa5);
      auVar27 = vshufps_avx(auVar119,auVar119,0x94);
      uVar1 = *(undefined4 *)(ray + k * 4);
      auVar159._4_4_ = uVar1;
      auVar159._0_4_ = uVar1;
      auVar159._8_4_ = uVar1;
      auVar159._12_4_ = uVar1;
      auVar159._16_4_ = uVar1;
      auVar159._20_4_ = uVar1;
      auVar159._24_4_ = uVar1;
      auVar159._28_4_ = uVar1;
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar170._4_4_ = uVar3;
      auVar170._0_4_ = uVar3;
      auVar170._8_4_ = uVar3;
      auVar170._12_4_ = uVar3;
      auVar170._16_4_ = uVar3;
      auVar170._20_4_ = uVar3;
      auVar170._24_4_ = uVar3;
      auVar170._28_4_ = uVar3;
      uVar4 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar174._4_4_ = uVar4;
      auVar174._0_4_ = uVar4;
      auVar174._8_4_ = uVar4;
      auVar174._12_4_ = uVar4;
      auVar174._16_4_ = uVar4;
      auVar174._20_4_ = uVar4;
      auVar174._24_4_ = uVar4;
      auVar174._28_4_ = uVar4;
      auVar30 = vsubps_avx(auVar30,auVar159);
      local_980 = vsubps_avx(auVar31,auVar170);
      local_9a0 = vsubps_avx(auVar32,auVar174);
      auVar140 = vsubps_avx(auVar140,auVar159);
      auVar137 = vsubps_avx(auVar137,auVar170);
      auVar31 = vsubps_avx(auVar26,auVar174);
      auVar80 = vsubps_avx(auVar80,auVar159);
      auVar141 = vsubps_avx(auVar141,auVar170);
      auVar26 = vsubps_avx(auVar27,auVar174);
      local_9c0 = vsubps_avx(auVar80,auVar30);
      local_9e0 = vsubps_avx(auVar141,local_980);
      local_a00 = vsubps_avx(auVar26,local_9a0);
      fVar8 = local_980._0_4_;
      fVar75 = auVar141._0_4_ + fVar8;
      fVar11 = local_980._4_4_;
      fVar83 = auVar141._4_4_ + fVar11;
      fVar96 = local_980._8_4_;
      fVar84 = auVar141._8_4_ + fVar96;
      fVar100 = local_980._12_4_;
      fVar85 = auVar141._12_4_ + fVar100;
      fVar13 = local_980._16_4_;
      fVar86 = auVar141._16_4_ + fVar13;
      fVar16 = local_980._20_4_;
      fVar87 = auVar141._20_4_ + fVar16;
      fVar19 = local_980._24_4_;
      fVar88 = auVar141._24_4_ + fVar19;
      fVar9 = local_9a0._0_4_;
      fVar145 = auVar26._0_4_ + fVar9;
      fVar92 = local_9a0._4_4_;
      fVar148 = auVar26._4_4_ + fVar92;
      fVar97 = local_9a0._8_4_;
      fVar149 = auVar26._8_4_ + fVar97;
      fVar101 = local_9a0._12_4_;
      fVar150 = auVar26._12_4_ + fVar101;
      fVar14 = local_9a0._16_4_;
      fVar151 = auVar26._16_4_ + fVar14;
      fVar17 = local_9a0._20_4_;
      fVar152 = auVar26._20_4_ + fVar17;
      fVar20 = local_9a0._24_4_;
      fVar153 = auVar26._24_4_ + fVar20;
      fVar146 = local_9a0._28_4_;
      fVar154 = auVar26._28_4_ + fVar146;
      fVar93 = local_a00._0_4_;
      fVar95 = local_a00._4_4_;
      auVar27._4_4_ = fVar83 * fVar95;
      auVar27._0_4_ = fVar75 * fVar93;
      fVar98 = local_a00._8_4_;
      auVar27._8_4_ = fVar84 * fVar98;
      fVar22 = local_a00._12_4_;
      auVar27._12_4_ = fVar85 * fVar22;
      fVar23 = local_a00._16_4_;
      auVar27._16_4_ = fVar86 * fVar23;
      fVar24 = local_a00._20_4_;
      auVar27._20_4_ = fVar87 * fVar24;
      fVar25 = local_a00._24_4_;
      auVar27._24_4_ = fVar88 * fVar25;
      auVar27._28_4_ = uVar1;
      fVar201 = local_9e0._0_4_;
      fVar204 = local_9e0._4_4_;
      auVar32._4_4_ = fVar204 * fVar148;
      auVar32._0_4_ = fVar201 * fVar145;
      fVar206 = local_9e0._8_4_;
      auVar32._8_4_ = fVar206 * fVar149;
      fVar208 = local_9e0._12_4_;
      auVar32._12_4_ = fVar208 * fVar150;
      fVar210 = local_9e0._16_4_;
      auVar32._16_4_ = fVar210 * fVar151;
      fVar212 = local_9e0._20_4_;
      auVar32._20_4_ = fVar212 * fVar152;
      fVar214 = local_9e0._24_4_;
      auVar32._24_4_ = fVar214 * fVar153;
      auVar32._28_4_ = uVar3;
      auVar27 = vsubps_avx(auVar32,auVar27);
      fVar10 = auVar30._0_4_;
      fVar155 = auVar80._0_4_ + fVar10;
      fVar94 = auVar30._4_4_;
      fVar162 = auVar80._4_4_ + fVar94;
      fVar99 = auVar30._8_4_;
      fVar164 = auVar80._8_4_ + fVar99;
      fVar12 = auVar30._12_4_;
      fVar165 = auVar80._12_4_ + fVar12;
      fVar15 = auVar30._16_4_;
      fVar166 = auVar80._16_4_ + fVar15;
      fVar18 = auVar30._20_4_;
      fVar167 = auVar80._20_4_ + fVar18;
      fVar21 = auVar30._24_4_;
      fVar168 = auVar80._24_4_ + fVar21;
      fVar171 = local_9c0._0_4_;
      fVar175 = local_9c0._4_4_;
      auVar28._4_4_ = fVar175 * fVar148;
      auVar28._0_4_ = fVar171 * fVar145;
      fVar178 = local_9c0._8_4_;
      auVar28._8_4_ = fVar178 * fVar149;
      fVar181 = local_9c0._12_4_;
      auVar28._12_4_ = fVar181 * fVar150;
      fVar184 = local_9c0._16_4_;
      auVar28._16_4_ = fVar184 * fVar151;
      fVar187 = local_9c0._20_4_;
      auVar28._20_4_ = fVar187 * fVar152;
      fVar190 = local_9c0._24_4_;
      auVar28._24_4_ = fVar190 * fVar153;
      auVar28._28_4_ = fVar154;
      auVar29._4_4_ = fVar162 * fVar95;
      auVar29._0_4_ = fVar155 * fVar93;
      auVar29._8_4_ = fVar164 * fVar98;
      auVar29._12_4_ = fVar165 * fVar22;
      auVar29._16_4_ = fVar166 * fVar23;
      auVar29._20_4_ = fVar167 * fVar24;
      auVar29._24_4_ = fVar168 * fVar25;
      auVar29._28_4_ = uVar3;
      auVar32 = vsubps_avx(auVar29,auVar28);
      auVar34._4_4_ = fVar162 * fVar204;
      auVar34._0_4_ = fVar155 * fVar201;
      auVar34._8_4_ = fVar164 * fVar206;
      auVar34._12_4_ = fVar165 * fVar208;
      auVar34._16_4_ = fVar166 * fVar210;
      auVar34._20_4_ = fVar167 * fVar212;
      auVar34._24_4_ = fVar168 * fVar214;
      auVar34._28_4_ = fVar154;
      auVar35._4_4_ = fVar175 * fVar83;
      auVar35._0_4_ = fVar171 * fVar75;
      auVar35._8_4_ = fVar178 * fVar84;
      auVar35._12_4_ = fVar181 * fVar85;
      auVar35._16_4_ = fVar184 * fVar86;
      auVar35._20_4_ = fVar187 * fVar87;
      auVar35._24_4_ = fVar190 * fVar88;
      auVar35._28_4_ = auVar141._28_4_ + local_980._28_4_;
      auVar28 = vsubps_avx(auVar35,auVar34);
      fVar75 = *(float *)(ray + k * 4 + 0x50);
      fVar83 = *(float *)(ray + k * 4 + 0x60);
      fVar84 = *(float *)(ray + k * 4 + 0x40);
      fVar156 = auVar27._0_4_ * fVar84 + fVar75 * auVar32._0_4_ + auVar28._0_4_ * fVar83;
      fVar163 = auVar27._4_4_ * fVar84 + fVar75 * auVar32._4_4_ + auVar28._4_4_ * fVar83;
      auVar157._0_8_ = CONCAT44(fVar163,fVar156);
      auVar157._8_4_ = auVar27._8_4_ * fVar84 + fVar75 * auVar32._8_4_ + auVar28._8_4_ * fVar83;
      auVar157._12_4_ = auVar27._12_4_ * fVar84 + fVar75 * auVar32._12_4_ + auVar28._12_4_ * fVar83;
      auVar158._16_4_ = auVar27._16_4_ * fVar84 + fVar75 * auVar32._16_4_ + auVar28._16_4_ * fVar83;
      auVar158._0_16_ = auVar157;
      auVar158._20_4_ = auVar27._20_4_ * fVar84 + fVar75 * auVar32._20_4_ + auVar28._20_4_ * fVar83;
      auVar160._24_4_ = auVar27._24_4_ * fVar84 + fVar75 * auVar32._24_4_ + auVar28._24_4_ * fVar83;
      auVar160._0_24_ = auVar158;
      auVar160._28_4_ = auVar27._28_4_ + auVar32._28_4_ + auVar28._28_4_;
      local_a20 = vsubps_avx(local_980,auVar137);
      local_a40 = vsubps_avx(local_9a0,auVar31);
      fVar86 = auVar137._0_4_ + fVar8;
      fVar87 = auVar137._4_4_ + fVar11;
      fVar88 = auVar137._8_4_ + fVar96;
      fVar145 = auVar137._12_4_ + fVar100;
      fVar148 = auVar137._16_4_ + fVar13;
      fVar149 = auVar137._20_4_ + fVar16;
      fVar150 = auVar137._24_4_ + fVar19;
      fVar151 = fVar9 + auVar31._0_4_;
      fVar152 = fVar92 + auVar31._4_4_;
      fVar153 = fVar97 + auVar31._8_4_;
      fVar154 = fVar101 + auVar31._12_4_;
      fVar155 = fVar14 + auVar31._16_4_;
      fVar162 = fVar17 + auVar31._20_4_;
      fVar164 = fVar20 + auVar31._24_4_;
      fVar85 = auVar31._28_4_;
      fVar172 = local_a40._0_4_;
      fVar176 = local_a40._4_4_;
      auVar36._4_4_ = fVar176 * fVar87;
      auVar36._0_4_ = fVar172 * fVar86;
      fVar179 = local_a40._8_4_;
      auVar36._8_4_ = fVar179 * fVar88;
      fVar182 = local_a40._12_4_;
      auVar36._12_4_ = fVar182 * fVar145;
      fVar185 = local_a40._16_4_;
      auVar36._16_4_ = fVar185 * fVar148;
      fVar188 = local_a40._20_4_;
      auVar36._20_4_ = fVar188 * fVar149;
      fVar191 = local_a40._24_4_;
      auVar36._24_4_ = fVar191 * fVar150;
      auVar36._28_4_ = auVar32._28_4_;
      fVar202 = local_a20._0_4_;
      fVar205 = local_a20._4_4_;
      auVar37._4_4_ = fVar205 * fVar152;
      auVar37._0_4_ = fVar202 * fVar151;
      fVar207 = local_a20._8_4_;
      auVar37._8_4_ = fVar207 * fVar153;
      fVar209 = local_a20._12_4_;
      auVar37._12_4_ = fVar209 * fVar154;
      fVar211 = local_a20._16_4_;
      auVar37._16_4_ = fVar211 * fVar155;
      fVar213 = local_a20._20_4_;
      auVar37._20_4_ = fVar213 * fVar162;
      fVar215 = local_a20._24_4_;
      auVar37._24_4_ = fVar215 * fVar164;
      auVar37._28_4_ = fVar146;
      auVar27 = vsubps_avx(auVar37,auVar36);
      auVar32 = vsubps_avx(auVar30,auVar140);
      fVar193 = auVar32._0_4_;
      fVar195 = auVar32._4_4_;
      auVar38._4_4_ = fVar195 * fVar152;
      auVar38._0_4_ = fVar193 * fVar151;
      fVar196 = auVar32._8_4_;
      auVar38._8_4_ = fVar196 * fVar153;
      fVar197 = auVar32._12_4_;
      auVar38._12_4_ = fVar197 * fVar154;
      fVar198 = auVar32._16_4_;
      auVar38._16_4_ = fVar198 * fVar155;
      fVar199 = auVar32._20_4_;
      auVar38._20_4_ = fVar199 * fVar162;
      fVar200 = auVar32._24_4_;
      auVar38._24_4_ = fVar200 * fVar164;
      auVar38._28_4_ = fVar146 + fVar85;
      fVar146 = fVar10 + auVar140._0_4_;
      fVar151 = fVar94 + auVar140._4_4_;
      fVar152 = fVar99 + auVar140._8_4_;
      fVar153 = fVar12 + auVar140._12_4_;
      fVar154 = fVar15 + auVar140._16_4_;
      fVar155 = fVar18 + auVar140._20_4_;
      fVar162 = fVar21 + auVar140._24_4_;
      auVar39._4_4_ = fVar151 * fVar176;
      auVar39._0_4_ = fVar146 * fVar172;
      auVar39._8_4_ = fVar152 * fVar179;
      auVar39._12_4_ = fVar153 * fVar182;
      auVar39._16_4_ = fVar154 * fVar185;
      auVar39._20_4_ = fVar155 * fVar188;
      auVar39._24_4_ = fVar162 * fVar191;
      auVar39._28_4_ = local_a40._28_4_;
      auVar32 = vsubps_avx(auVar39,auVar38);
      auVar40._4_4_ = fVar151 * fVar205;
      auVar40._0_4_ = fVar146 * fVar202;
      auVar40._8_4_ = fVar152 * fVar207;
      auVar40._12_4_ = fVar153 * fVar209;
      auVar40._16_4_ = fVar154 * fVar211;
      auVar40._20_4_ = fVar155 * fVar213;
      auVar40._24_4_ = fVar162 * fVar215;
      auVar40._28_4_ = auVar30._28_4_ + auVar140._28_4_;
      auVar41._4_4_ = fVar195 * fVar87;
      auVar41._0_4_ = fVar193 * fVar86;
      auVar41._8_4_ = fVar196 * fVar88;
      auVar41._12_4_ = fVar197 * fVar145;
      auVar41._16_4_ = fVar198 * fVar148;
      auVar41._20_4_ = fVar199 * fVar149;
      auVar41._24_4_ = fVar200 * fVar150;
      auVar41._28_4_ = auVar137._28_4_ + local_980._28_4_;
      auVar28 = vsubps_avx(auVar41,auVar40);
      local_a60._0_4_ = fVar84 * auVar27._0_4_ + auVar28._0_4_ * fVar83 + fVar75 * auVar32._0_4_;
      local_a60._4_4_ = fVar84 * auVar27._4_4_ + auVar28._4_4_ * fVar83 + fVar75 * auVar32._4_4_;
      local_a60._8_4_ = fVar84 * auVar27._8_4_ + auVar28._8_4_ * fVar83 + fVar75 * auVar32._8_4_;
      local_a60._12_4_ = fVar84 * auVar27._12_4_ + auVar28._12_4_ * fVar83 + fVar75 * auVar32._12_4_
      ;
      local_a60._16_4_ = fVar84 * auVar27._16_4_ + auVar28._16_4_ * fVar83 + fVar75 * auVar32._16_4_
      ;
      local_a60._20_4_ = fVar84 * auVar27._20_4_ + auVar28._20_4_ * fVar83 + fVar75 * auVar32._20_4_
      ;
      local_a60._24_4_ = fVar84 * auVar27._24_4_ + auVar28._24_4_ * fVar83 + fVar75 * auVar32._24_4_
      ;
      local_a60._28_4_ = auVar32._28_4_ + auVar28._28_4_ + auVar32._28_4_;
      auVar32 = vsubps_avx(auVar140,auVar80);
      fVar166 = auVar140._0_4_ + auVar80._0_4_;
      fVar167 = auVar140._4_4_ + auVar80._4_4_;
      fVar168 = auVar140._8_4_ + auVar80._8_4_;
      fVar111 = auVar140._12_4_ + auVar80._12_4_;
      fVar112 = auVar140._16_4_ + auVar80._16_4_;
      fVar113 = auVar140._20_4_ + auVar80._20_4_;
      fVar114 = auVar140._24_4_ + auVar80._24_4_;
      auVar28 = vsubps_avx(auVar137,auVar141);
      fVar115 = auVar137._0_4_ + auVar141._0_4_;
      fVar126 = auVar137._4_4_ + auVar141._4_4_;
      fVar127 = auVar137._8_4_ + auVar141._8_4_;
      fVar128 = auVar137._12_4_ + auVar141._12_4_;
      fVar129 = auVar137._16_4_ + auVar141._16_4_;
      fVar130 = auVar137._20_4_ + auVar141._20_4_;
      fVar131 = auVar137._24_4_ + auVar141._24_4_;
      auVar29 = vsubps_avx(auVar31,auVar26);
      fVar152 = auVar31._0_4_ + auVar26._0_4_;
      fVar153 = auVar31._4_4_ + auVar26._4_4_;
      fVar154 = auVar31._8_4_ + auVar26._8_4_;
      fVar155 = auVar31._12_4_ + auVar26._12_4_;
      fVar162 = auVar31._16_4_ + auVar26._16_4_;
      fVar164 = auVar31._20_4_ + auVar26._20_4_;
      fVar165 = auVar31._24_4_ + auVar26._24_4_;
      fVar146 = auVar29._0_4_;
      fVar86 = auVar29._4_4_;
      auVar31._4_4_ = fVar126 * fVar86;
      auVar31._0_4_ = fVar115 * fVar146;
      fVar87 = auVar29._8_4_;
      auVar31._8_4_ = fVar127 * fVar87;
      fVar88 = auVar29._12_4_;
      auVar31._12_4_ = fVar128 * fVar88;
      fVar145 = auVar29._16_4_;
      auVar31._16_4_ = fVar129 * fVar145;
      fVar148 = auVar29._20_4_;
      auVar31._20_4_ = fVar130 * fVar148;
      fVar149 = auVar29._24_4_;
      auVar31._24_4_ = fVar131 * fVar149;
      auVar31._28_4_ = auVar27._28_4_;
      fVar173 = auVar28._0_4_;
      fVar177 = auVar28._4_4_;
      auVar42._4_4_ = fVar177 * fVar153;
      auVar42._0_4_ = fVar173 * fVar152;
      fVar180 = auVar28._8_4_;
      auVar42._8_4_ = fVar180 * fVar154;
      fVar183 = auVar28._12_4_;
      auVar42._12_4_ = fVar183 * fVar155;
      fVar186 = auVar28._16_4_;
      auVar42._16_4_ = fVar186 * fVar162;
      fVar189 = auVar28._20_4_;
      auVar42._20_4_ = fVar189 * fVar164;
      fVar192 = auVar28._24_4_;
      auVar42._24_4_ = fVar192 * fVar165;
      auVar42._28_4_ = fVar85;
      auVar31 = vsubps_avx(auVar42,auVar31);
      fVar150 = auVar32._0_4_;
      fVar151 = auVar32._4_4_;
      auVar43._4_4_ = fVar151 * fVar153;
      auVar43._0_4_ = fVar150 * fVar152;
      fVar152 = auVar32._8_4_;
      auVar43._8_4_ = fVar152 * fVar154;
      fVar153 = auVar32._12_4_;
      auVar43._12_4_ = fVar153 * fVar155;
      fVar154 = auVar32._16_4_;
      auVar43._16_4_ = fVar154 * fVar162;
      fVar155 = auVar32._20_4_;
      auVar43._20_4_ = fVar155 * fVar164;
      fVar162 = auVar32._24_4_;
      auVar43._24_4_ = fVar162 * fVar165;
      auVar43._28_4_ = fVar85 + auVar26._28_4_;
      auVar26._4_4_ = fVar167 * fVar86;
      auVar26._0_4_ = fVar166 * fVar146;
      auVar26._8_4_ = fVar168 * fVar87;
      auVar26._12_4_ = fVar111 * fVar88;
      auVar26._16_4_ = fVar112 * fVar145;
      auVar26._20_4_ = fVar113 * fVar148;
      auVar26._24_4_ = fVar114 * fVar149;
      auVar26._28_4_ = fVar85;
      auVar26 = vsubps_avx(auVar26,auVar43);
      auVar44._4_4_ = fVar177 * fVar167;
      auVar44._0_4_ = fVar173 * fVar166;
      auVar44._8_4_ = fVar180 * fVar168;
      auVar44._12_4_ = fVar183 * fVar111;
      auVar44._16_4_ = fVar186 * fVar112;
      auVar44._20_4_ = fVar189 * fVar113;
      auVar44._24_4_ = fVar192 * fVar114;
      auVar44._28_4_ = auVar140._28_4_ + auVar80._28_4_;
      auVar45._4_4_ = fVar151 * fVar126;
      auVar45._0_4_ = fVar150 * fVar115;
      auVar45._8_4_ = fVar152 * fVar127;
      auVar45._12_4_ = fVar153 * fVar128;
      auVar45._16_4_ = fVar154 * fVar129;
      auVar45._20_4_ = fVar155 * fVar130;
      auVar45._24_4_ = fVar162 * fVar131;
      auVar45._28_4_ = auVar137._28_4_ + auVar141._28_4_;
      auVar140 = vsubps_avx(auVar45,auVar44);
      auVar108._0_4_ = fVar84 * auVar31._0_4_ + auVar140._0_4_ * fVar83 + fVar75 * auVar26._0_4_;
      auVar108._4_4_ = fVar84 * auVar31._4_4_ + auVar140._4_4_ * fVar83 + fVar75 * auVar26._4_4_;
      auVar108._8_4_ = fVar84 * auVar31._8_4_ + auVar140._8_4_ * fVar83 + fVar75 * auVar26._8_4_;
      auVar108._12_4_ = fVar84 * auVar31._12_4_ + auVar140._12_4_ * fVar83 + fVar75 * auVar26._12_4_
      ;
      auVar108._16_4_ = fVar84 * auVar31._16_4_ + auVar140._16_4_ * fVar83 + fVar75 * auVar26._16_4_
      ;
      auVar108._20_4_ = fVar84 * auVar31._20_4_ + auVar140._20_4_ * fVar83 + fVar75 * auVar26._20_4_
      ;
      auVar108._24_4_ = fVar84 * auVar31._24_4_ + auVar140._24_4_ * fVar83 + fVar75 * auVar26._24_4_
      ;
      auVar108._28_4_ = auVar140._28_4_ + auVar140._28_4_ + auVar26._28_4_;
      fVar164 = auVar108._0_4_ + fVar156 + local_a60._0_4_;
      fVar166 = auVar108._4_4_ + fVar163 + local_a60._4_4_;
      auVar117._0_8_ = CONCAT44(fVar166,fVar164);
      auVar117._8_4_ = auVar108._8_4_ + auVar157._8_4_ + local_a60._8_4_;
      auVar117._12_4_ = auVar108._12_4_ + auVar157._12_4_ + local_a60._12_4_;
      auVar118._16_4_ = auVar108._16_4_ + auVar158._16_4_ + local_a60._16_4_;
      auVar118._0_16_ = auVar117;
      auVar118._20_4_ = auVar108._20_4_ + auVar158._20_4_ + local_a60._20_4_;
      auVar120._24_4_ = auVar108._24_4_ + auVar160._24_4_ + local_a60._24_4_;
      auVar120._0_24_ = auVar118;
      auVar120._28_4_ = auVar108._28_4_ + auVar160._28_4_ + local_a60._28_4_;
      auVar140 = vminps_avx(auVar160,local_a60);
      auVar140 = vminps_avx(auVar140,auVar108);
      auVar143._8_4_ = 0x7fffffff;
      auVar143._0_8_ = 0x7fffffff7fffffff;
      auVar143._12_4_ = 0x7fffffff;
      auVar143._16_4_ = 0x7fffffff;
      auVar143._20_4_ = 0x7fffffff;
      auVar143._24_4_ = 0x7fffffff;
      auVar143._28_4_ = 0x7fffffff;
      local_a80 = vandps_avx(auVar143,auVar120);
      fVar165 = local_a80._0_4_ * 1.1920929e-07;
      fVar167 = local_a80._4_4_ * 1.1920929e-07;
      auVar46._4_4_ = fVar167;
      auVar46._0_4_ = fVar165;
      fVar168 = local_a80._8_4_ * 1.1920929e-07;
      auVar46._8_4_ = fVar168;
      fVar111 = local_a80._12_4_ * 1.1920929e-07;
      auVar46._12_4_ = fVar111;
      fVar112 = local_a80._16_4_ * 1.1920929e-07;
      auVar46._16_4_ = fVar112;
      fVar113 = local_a80._20_4_ * 1.1920929e-07;
      auVar46._20_4_ = fVar113;
      fVar114 = local_a80._24_4_ * 1.1920929e-07;
      auVar46._24_4_ = fVar114;
      auVar46._28_4_ = 0x34000000;
      auVar133._0_8_ = CONCAT44(fVar167,fVar165) ^ 0x8000000080000000;
      auVar133._8_4_ = -fVar168;
      auVar133._12_4_ = -fVar111;
      auVar133._16_4_ = -fVar112;
      auVar133._20_4_ = -fVar113;
      auVar133._24_4_ = -fVar114;
      auVar133._28_4_ = 0xb4000000;
      auVar140 = vcmpps_avx(auVar140,auVar133,5);
      auVar137 = vmaxps_avx(auVar160,local_a60);
      auVar80 = vmaxps_avx(auVar137,auVar108);
      auVar80 = vcmpps_avx(auVar80,auVar46,2);
      auVar140 = vorps_avx(auVar140,auVar80);
      if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar140 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar140 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar140 >> 0x7f,0) != '\0') ||
            (auVar140 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar140 >> 0xbf,0) != '\0') ||
          (auVar140 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar140[0x1f] < '\0') {
        auVar47._4_4_ = fVar205 * fVar95;
        auVar47._0_4_ = fVar202 * fVar93;
        auVar47._8_4_ = fVar207 * fVar98;
        auVar47._12_4_ = fVar209 * fVar22;
        auVar47._16_4_ = fVar211 * fVar23;
        auVar47._20_4_ = fVar213 * fVar24;
        auVar47._24_4_ = fVar215 * fVar25;
        auVar47._28_4_ = auVar80._28_4_;
        auVar48._4_4_ = fVar204 * fVar176;
        auVar48._0_4_ = fVar201 * fVar172;
        auVar48._8_4_ = fVar206 * fVar179;
        auVar48._12_4_ = fVar208 * fVar182;
        auVar48._16_4_ = fVar210 * fVar185;
        auVar48._20_4_ = fVar212 * fVar188;
        auVar48._24_4_ = fVar214 * fVar191;
        auVar48._28_4_ = 0x34000000;
        auVar141 = vsubps_avx(auVar48,auVar47);
        auVar49._4_4_ = fVar177 * fVar176;
        auVar49._0_4_ = fVar173 * fVar172;
        auVar49._8_4_ = fVar180 * fVar179;
        auVar49._12_4_ = fVar183 * fVar182;
        auVar49._16_4_ = fVar186 * fVar185;
        auVar49._20_4_ = fVar189 * fVar188;
        auVar49._24_4_ = fVar192 * fVar191;
        auVar49._28_4_ = auVar137._28_4_;
        auVar50._4_4_ = fVar205 * fVar86;
        auVar50._0_4_ = fVar202 * fVar146;
        auVar50._8_4_ = fVar207 * fVar87;
        auVar50._12_4_ = fVar209 * fVar88;
        auVar50._16_4_ = fVar211 * fVar145;
        auVar50._20_4_ = fVar213 * fVar148;
        auVar50._24_4_ = fVar215 * fVar149;
        auVar50._28_4_ = fVar85;
        auVar31 = vsubps_avx(auVar50,auVar49);
        auVar80 = vandps_avx(auVar143,auVar47);
        auVar137 = vandps_avx(auVar143,auVar49);
        auVar80 = vcmpps_avx(auVar80,auVar137,1);
        local_860 = vblendvps_avx(auVar31,auVar141,auVar80);
        auVar51._4_4_ = fVar195 * fVar86;
        auVar51._0_4_ = fVar193 * fVar146;
        auVar51._8_4_ = fVar196 * fVar87;
        auVar51._12_4_ = fVar197 * fVar88;
        auVar51._16_4_ = fVar198 * fVar145;
        auVar51._20_4_ = fVar199 * fVar148;
        auVar51._24_4_ = fVar200 * fVar149;
        auVar51._28_4_ = auVar29._28_4_;
        auVar52._4_4_ = fVar195 * fVar95;
        auVar52._0_4_ = fVar193 * fVar93;
        auVar52._8_4_ = fVar196 * fVar98;
        auVar52._12_4_ = fVar197 * fVar22;
        auVar52._16_4_ = fVar198 * fVar23;
        auVar52._20_4_ = fVar199 * fVar24;
        auVar52._24_4_ = fVar200 * fVar25;
        auVar52._28_4_ = auVar141._28_4_;
        auVar53._4_4_ = fVar175 * fVar176;
        auVar53._0_4_ = fVar171 * fVar172;
        auVar53._8_4_ = fVar178 * fVar179;
        auVar53._12_4_ = fVar181 * fVar182;
        auVar53._16_4_ = fVar184 * fVar185;
        auVar53._20_4_ = fVar187 * fVar188;
        auVar53._24_4_ = fVar190 * fVar191;
        auVar53._28_4_ = auVar137._28_4_;
        auVar141 = vsubps_avx(auVar52,auVar53);
        auVar54._4_4_ = fVar176 * fVar151;
        auVar54._0_4_ = fVar172 * fVar150;
        auVar54._8_4_ = fVar179 * fVar152;
        auVar54._12_4_ = fVar182 * fVar153;
        auVar54._16_4_ = fVar185 * fVar154;
        auVar54._20_4_ = fVar188 * fVar155;
        auVar54._24_4_ = fVar191 * fVar162;
        auVar54._28_4_ = auVar31._28_4_;
        auVar31 = vsubps_avx(auVar54,auVar51);
        auVar80 = vandps_avx(auVar143,auVar53);
        auVar137 = vandps_avx(auVar143,auVar51);
        auVar137 = vcmpps_avx(auVar80,auVar137,1);
        local_840 = vblendvps_avx(auVar31,auVar141,auVar137);
        auVar55._4_4_ = fVar205 * fVar151;
        auVar55._0_4_ = fVar202 * fVar150;
        auVar55._8_4_ = fVar207 * fVar152;
        auVar55._12_4_ = fVar209 * fVar153;
        auVar55._16_4_ = fVar211 * fVar154;
        auVar55._20_4_ = fVar213 * fVar155;
        auVar55._24_4_ = fVar215 * fVar162;
        auVar55._28_4_ = auVar32._28_4_;
        auVar56._4_4_ = fVar175 * fVar205;
        auVar56._0_4_ = fVar171 * fVar202;
        auVar56._8_4_ = fVar178 * fVar207;
        auVar56._12_4_ = fVar181 * fVar209;
        auVar56._16_4_ = fVar184 * fVar211;
        auVar56._20_4_ = fVar187 * fVar213;
        auVar56._24_4_ = fVar190 * fVar215;
        auVar56._28_4_ = auVar137._28_4_;
        auVar57._4_4_ = fVar195 * fVar204;
        auVar57._0_4_ = fVar193 * fVar201;
        auVar57._8_4_ = fVar196 * fVar206;
        auVar57._12_4_ = fVar197 * fVar208;
        auVar57._16_4_ = fVar198 * fVar210;
        auVar57._20_4_ = fVar199 * fVar212;
        auVar57._24_4_ = fVar200 * fVar214;
        auVar57._28_4_ = auVar141._28_4_;
        auVar58._4_4_ = fVar195 * fVar177;
        auVar58._0_4_ = fVar193 * fVar173;
        auVar58._8_4_ = fVar196 * fVar180;
        auVar58._12_4_ = fVar197 * fVar183;
        auVar58._16_4_ = fVar198 * fVar186;
        auVar58._20_4_ = fVar199 * fVar189;
        auVar58._24_4_ = fVar200 * fVar192;
        auVar58._28_4_ = local_a00._28_4_;
        auVar31 = vsubps_avx(auVar56,auVar57);
        auVar26 = vsubps_avx(auVar58,auVar55);
        auVar137 = vandps_avx(auVar143,auVar57);
        auVar141 = vandps_avx(auVar143,auVar55);
        auVar141 = vcmpps_avx(auVar137,auVar141,1);
        local_820 = vblendvps_avx(auVar26,auVar31,auVar141);
        auVar79 = vpackssdw_avx(auVar140._0_16_,auVar140._16_16_);
        fVar146 = fVar84 * local_860._0_4_ + local_820._0_4_ * fVar83 + local_840._0_4_ * fVar75;
        fVar85 = fVar84 * local_860._4_4_ + local_820._4_4_ * fVar83 + local_840._4_4_ * fVar75;
        fVar93 = fVar84 * local_860._8_4_ + local_820._8_4_ * fVar83 + local_840._8_4_ * fVar75;
        fVar95 = fVar84 * local_860._12_4_ + local_820._12_4_ * fVar83 + local_840._12_4_ * fVar75;
        fVar86 = fVar84 * local_860._16_4_ + local_820._16_4_ * fVar83 + local_840._16_4_ * fVar75;
        fVar98 = fVar84 * local_860._20_4_ + local_820._20_4_ * fVar83 + local_840._20_4_ * fVar75;
        fVar75 = fVar84 * local_860._24_4_ + local_820._24_4_ * fVar83 + local_840._24_4_ * fVar75;
        fVar83 = auVar26._28_4_ + auVar26._28_4_ + 0.0;
        auVar104._0_4_ = fVar146 + fVar146;
        auVar104._4_4_ = fVar85 + fVar85;
        auVar104._8_4_ = fVar93 + fVar93;
        auVar104._12_4_ = fVar95 + fVar95;
        auVar104._16_4_ = fVar86 + fVar86;
        auVar104._20_4_ = fVar98 + fVar98;
        auVar104._24_4_ = fVar75 + fVar75;
        auVar104._28_4_ = fVar83 + fVar83;
        fVar146 = local_860._0_4_ * fVar10 + local_820._0_4_ * fVar9 + local_840._0_4_ * fVar8;
        fVar92 = local_860._4_4_ * fVar94 + local_820._4_4_ * fVar92 + local_840._4_4_ * fVar11;
        fVar94 = local_860._8_4_ * fVar99 + local_820._8_4_ * fVar97 + local_840._8_4_ * fVar96;
        fVar96 = local_860._12_4_ * fVar12 + local_820._12_4_ * fVar101 + local_840._12_4_ * fVar100
        ;
        fVar97 = local_860._16_4_ * fVar15 + local_820._16_4_ * fVar14 + local_840._16_4_ * fVar13;
        fVar99 = local_860._20_4_ * fVar18 + local_820._20_4_ * fVar17 + local_840._20_4_ * fVar16;
        fVar100 = local_860._24_4_ * fVar21 + local_820._24_4_ * fVar20 + local_840._24_4_ * fVar19;
        fVar101 = auVar137._28_4_ + fVar83 + auVar137._28_4_;
        auVar140 = vrcpps_avx(auVar104);
        fVar75 = auVar140._0_4_;
        fVar83 = auVar140._4_4_;
        auVar59._4_4_ = auVar104._4_4_ * fVar83;
        auVar59._0_4_ = auVar104._0_4_ * fVar75;
        fVar84 = auVar140._8_4_;
        auVar59._8_4_ = auVar104._8_4_ * fVar84;
        fVar8 = auVar140._12_4_;
        auVar59._12_4_ = auVar104._12_4_ * fVar8;
        fVar9 = auVar140._16_4_;
        auVar59._16_4_ = auVar104._16_4_ * fVar9;
        fVar10 = auVar140._20_4_;
        auVar59._20_4_ = auVar104._20_4_ * fVar10;
        fVar11 = auVar140._24_4_;
        auVar59._24_4_ = auVar104._24_4_ * fVar11;
        auVar59._28_4_ = auVar80._28_4_;
        auVar138._8_4_ = 0x3f800000;
        auVar138._0_8_ = 0x3f8000003f800000;
        auVar138._12_4_ = 0x3f800000;
        auVar138._16_4_ = 0x3f800000;
        auVar138._20_4_ = 0x3f800000;
        auVar138._24_4_ = 0x3f800000;
        auVar138._28_4_ = 0x3f800000;
        auVar140 = vsubps_avx(auVar138,auVar59);
        local_880._4_4_ = (fVar92 + fVar92) * (fVar83 + fVar83 * auVar140._4_4_);
        local_880._0_4_ = (fVar146 + fVar146) * (fVar75 + fVar75 * auVar140._0_4_);
        local_880._8_4_ = (fVar94 + fVar94) * (fVar84 + fVar84 * auVar140._8_4_);
        local_880._12_4_ = (fVar96 + fVar96) * (fVar8 + fVar8 * auVar140._12_4_);
        local_880._16_4_ = (fVar97 + fVar97) * (fVar9 + fVar9 * auVar140._16_4_);
        local_880._20_4_ = (fVar99 + fVar99) * (fVar10 + fVar10 * auVar140._20_4_);
        local_880._24_4_ = (fVar100 + fVar100) * (fVar11 + fVar11 * auVar140._24_4_);
        local_880._28_4_ = fVar101 + fVar101;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar121._4_4_ = uVar1;
        auVar121._0_4_ = uVar1;
        auVar121._8_4_ = uVar1;
        auVar121._12_4_ = uVar1;
        auVar121._16_4_ = uVar1;
        auVar121._20_4_ = uVar1;
        auVar121._24_4_ = uVar1;
        auVar121._28_4_ = uVar1;
        auVar140 = vcmpps_avx(auVar121,local_880,2);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        local_b40._4_4_ = uVar1;
        local_b40._0_4_ = uVar1;
        local_b40._8_4_ = uVar1;
        local_b40._12_4_ = uVar1;
        local_b40._16_4_ = uVar1;
        local_b40._20_4_ = uVar1;
        local_b40._24_4_ = uVar1;
        local_b40._28_4_ = uVar1;
        auVar80 = vcmpps_avx(local_880,local_b40,2);
        auVar140 = vandps_avx(auVar80,auVar140);
        auVar107 = vpackssdw_avx(auVar140._0_16_,auVar140._16_16_);
        auVar79 = vpand_avx(auVar107,auVar79);
        auVar107 = vpmovsxwd_avx(auVar79);
        auVar89 = vpshufd_avx(auVar79,0xee);
        auVar89 = vpmovsxwd_avx(auVar89);
        auVar122._16_16_ = auVar89;
        auVar122._0_16_ = auVar107;
        if ((((((((auVar122 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar122 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar122 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar122 >> 0x7f,0) != '\0') ||
              (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar89 >> 0x3f,0) != '\0') ||
            (auVar122 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar89[0xf] < '\0') {
          auVar140 = vcmpps_avx(auVar104,_DAT_01f7b000,4);
          auVar107 = vpackssdw_avx(auVar140._0_16_,auVar140._16_16_);
          auVar79 = vpand_avx(auVar79,auVar107);
          auVar107 = vpmovsxwd_avx(auVar79);
          auVar89 = vpunpckhwd_avx(auVar79,auVar79);
          local_8e0._16_16_ = auVar89;
          local_8e0._0_16_ = auVar107;
          if ((((((((local_8e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (local_8e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_8e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(local_8e0 >> 0x7f,0) != '\0') ||
                (local_8e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar89 >> 0x3f,0) != '\0') ||
              (local_8e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar89[0xf] < '\0') {
            local_be0._8_8_ = auVar157._8_8_;
            auStack_bd0._0_8_ = auVar158._16_8_;
            auStack_bd0._8_8_ = auVar160._24_8_;
            uStack_958 = local_be0._8_8_;
            uStack_950 = auStack_bd0._0_8_;
            uStack_948 = auStack_bd0._8_8_;
            local_bc0._8_8_ = auVar117._8_8_;
            auStack_bb0._0_8_ = auVar118._16_8_;
            auStack_bb0._8_8_ = auVar120._24_8_;
            uStack_918 = local_bc0._8_8_;
            uStack_910 = auStack_bb0._0_8_;
            uStack_908 = auStack_bb0._8_8_;
            local_900 = &local_c58;
            pGVar71 = (context->scene->geometries).items[pGVar68->_geomID].ptr;
            if ((pGVar71->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar71->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00f16081:
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                goto LAB_00f1608d;
              }
              auVar107 = *(undefined1 (*) [16])(local_c58 + local_c50 * 4);
              auVar89 = auVar107;
              if (2 < local_c48) {
                auVar89 = *(undefined1 (*) [16])(local_c58 + local_c50 * 8);
              }
              auVar140 = vrcpps_avx(auVar120);
              fVar75 = auVar140._0_4_;
              fVar83 = auVar140._4_4_;
              auVar60._4_4_ = fVar166 * fVar83;
              auVar60._0_4_ = fVar164 * fVar75;
              fVar84 = auVar140._8_4_;
              auVar60._8_4_ = auVar117._8_4_ * fVar84;
              fVar8 = auVar140._12_4_;
              auVar60._12_4_ = auVar117._12_4_ * fVar8;
              fVar9 = auVar140._16_4_;
              auVar60._16_4_ = auVar118._16_4_ * fVar9;
              fVar10 = auVar140._20_4_;
              auVar60._20_4_ = auVar118._20_4_ * fVar10;
              fVar11 = auVar140._24_4_;
              auVar60._24_4_ = auVar120._24_4_ * fVar11;
              auVar60._28_4_ = auVar120._28_4_;
              auVar123._8_4_ = 0x3f800000;
              auVar123._0_8_ = 0x3f8000003f800000;
              auVar123._12_4_ = 0x3f800000;
              auVar123._16_4_ = 0x3f800000;
              auVar123._20_4_ = 0x3f800000;
              auVar123._24_4_ = 0x3f800000;
              auVar123._28_4_ = 0x3f800000;
              auVar80 = vsubps_avx(auVar123,auVar60);
              auVar81._0_4_ = fVar75 + fVar75 * auVar80._0_4_;
              auVar81._4_4_ = fVar83 + fVar83 * auVar80._4_4_;
              auVar81._8_4_ = fVar84 + fVar84 * auVar80._8_4_;
              auVar81._12_4_ = fVar8 + fVar8 * auVar80._12_4_;
              auVar81._16_4_ = fVar9 + fVar9 * auVar80._16_4_;
              auVar81._20_4_ = fVar10 + fVar10 * auVar80._20_4_;
              auVar81._24_4_ = fVar11 + fVar11 * auVar80._24_4_;
              auVar81._28_4_ = auVar140._28_4_ + auVar80._28_4_;
              auVar91._8_4_ = 0x219392ef;
              auVar91._0_8_ = 0x219392ef219392ef;
              auVar91._12_4_ = 0x219392ef;
              auVar91._16_4_ = 0x219392ef;
              auVar91._20_4_ = 0x219392ef;
              auVar91._24_4_ = 0x219392ef;
              auVar91._28_4_ = 0x219392ef;
              auVar140 = vcmpps_avx(local_a80,auVar91,5);
              auVar140 = vandps_avx(auVar140,auVar81);
              auVar61._4_4_ = auVar140._4_4_ * fVar163;
              auVar61._0_4_ = auVar140._0_4_ * fVar156;
              auVar61._8_4_ = auVar140._8_4_ * auVar157._8_4_;
              auVar61._12_4_ = auVar140._12_4_ * auVar157._12_4_;
              auVar61._16_4_ = auVar140._16_4_ * auVar158._16_4_;
              auVar61._20_4_ = auVar140._20_4_ * auVar158._20_4_;
              auVar61._24_4_ = auVar140._24_4_ * auVar160._24_4_;
              auVar61._28_4_ = auVar81._28_4_;
              local_c20 = vminps_avx(auVar61,auVar123);
              auVar62._4_4_ = local_a60._4_4_ * auVar140._4_4_;
              auVar62._0_4_ = local_a60._0_4_ * auVar140._0_4_;
              auVar62._8_4_ = local_a60._8_4_ * auVar140._8_4_;
              auVar62._12_4_ = local_a60._12_4_ * auVar140._12_4_;
              auVar62._16_4_ = local_a60._16_4_ * auVar140._16_4_;
              auVar62._20_4_ = local_a60._20_4_ * auVar140._20_4_;
              auVar62._24_4_ = local_a60._24_4_ * auVar140._24_4_;
              auVar62._28_4_ = auVar140._28_4_;
              local_c40 = vminps_avx(auVar62,auVar123);
              auVar136 = *(undefined1 (*) [16])local_c58;
              if (local_c50 == 2) {
                auVar136 = vpshufd_avx(auVar136,0x54);
                auVar107 = vpshufd_avx(auVar107,0x54);
                auVar89 = vpshufd_avx(auVar89,0x54);
              }
              auVar134._16_16_ = auVar107;
              auVar134._0_16_ = auVar136;
              auVar139._16_16_ = auVar89;
              auVar139._0_16_ = auVar107;
              auVar140 = vunpcklps_avx(auVar134,auVar139);
              auVar136 = vpshufd_avx(auVar136,0xa5);
              auVar102 = vpshufd_avx(auVar107,0xa5);
              auVar144._16_16_ = auVar102;
              auVar144._0_16_ = auVar136;
              auVar107 = vpshufd_avx(auVar107,0x94);
              auVar89 = vpshufd_avx(auVar89,0x94);
              auVar147._16_16_ = auVar89;
              auVar147._0_16_ = auVar107;
              auVar161._0_16_ = vpsrld_avx(auVar140._0_16_,0x10);
              auVar169 = vpsrld_avx(auVar140._16_16_,0x10);
              auVar82._8_4_ = 0xffff;
              auVar82._0_8_ = 0xffff0000ffff;
              auVar82._12_4_ = 0xffff;
              auVar82._16_4_ = 0xffff;
              auVar82._20_4_ = 0xffff;
              auVar82._24_4_ = 0xffff;
              auVar82._28_4_ = 0xffff;
              auVar140 = vandps_avx(auVar140,auVar82);
              auVar80 = vcvtdq2ps_avx(auVar140);
              auVar161._16_16_ = auVar169;
              auVar137 = vcvtdq2ps_avx(auVar161);
              auVar124._0_16_ = vpsrld_avx(auVar136,0x10);
              auVar136 = vpsrld_avx(auVar102,0x10);
              auVar140 = vandps_avx(auVar144,auVar82);
              auVar141 = vcvtdq2ps_avx(auVar140);
              auVar124._16_16_ = auVar136;
              auVar31 = vcvtdq2ps_avx(auVar124);
              auVar105._0_16_ = vpsrld_avx(auVar107,0x10);
              auVar107 = vpsrld_avx(auVar89,0x10);
              auVar140 = vandps_avx(auVar147,auVar82);
              auVar140 = vcvtdq2ps_avx(auVar140);
              auVar105._16_16_ = auVar107;
              auVar26 = vcvtdq2ps_avx(auVar105);
              auVar125._8_4_ = 0x3f800000;
              auVar125._0_8_ = 0x3f8000003f800000;
              auVar125._12_4_ = 0x3f800000;
              auVar125._16_4_ = 0x3f800000;
              auVar125._20_4_ = 0x3f800000;
              auVar125._24_4_ = 0x3f800000;
              auVar125._28_4_ = 0x3f800000;
              auVar27 = vsubps_avx(auVar125,local_c20);
              auVar27 = vsubps_avx(auVar27,local_c40);
              local_8c0._0_4_ =
                   local_c40._0_4_ * auVar140._0_4_ * 0.00012207031 +
                   auVar141._0_4_ * 0.00012207031 * local_c20._0_4_ +
                   auVar27._0_4_ * auVar80._0_4_ * 0.00012207031;
              local_8c0._4_4_ =
                   local_c40._4_4_ * auVar140._4_4_ * 0.00012207031 +
                   auVar141._4_4_ * 0.00012207031 * local_c20._4_4_ +
                   auVar27._4_4_ * auVar80._4_4_ * 0.00012207031;
              local_8c0._8_4_ =
                   local_c40._8_4_ * auVar140._8_4_ * 0.00012207031 +
                   auVar141._8_4_ * 0.00012207031 * local_c20._8_4_ +
                   auVar27._8_4_ * auVar80._8_4_ * 0.00012207031;
              local_8c0._12_4_ =
                   local_c40._12_4_ * auVar140._12_4_ * 0.00012207031 +
                   auVar141._12_4_ * 0.00012207031 * local_c20._12_4_ +
                   auVar27._12_4_ * auVar80._12_4_ * 0.00012207031;
              local_8c0._16_4_ =
                   local_c40._16_4_ * auVar140._16_4_ * 0.00012207031 +
                   auVar141._16_4_ * 0.00012207031 * local_c20._16_4_ +
                   auVar27._16_4_ * auVar80._16_4_ * 0.00012207031;
              local_8c0._20_4_ =
                   local_c40._20_4_ * auVar140._20_4_ * 0.00012207031 +
                   auVar141._20_4_ * 0.00012207031 * local_c20._20_4_ +
                   auVar27._20_4_ * auVar80._20_4_ * 0.00012207031;
              local_8c0._24_4_ =
                   local_c40._24_4_ * auVar140._24_4_ * 0.00012207031 +
                   auVar141._24_4_ * 0.00012207031 * local_c20._24_4_ +
                   auVar27._24_4_ * auVar80._24_4_ * 0.00012207031;
              local_8c0._28_4_ = auVar140._28_4_ + 0.0 + local_c40._28_4_;
              local_8a0[0] = local_c40._0_4_ * auVar26._0_4_ * 0.00012207031 +
                             local_c20._0_4_ * auVar31._0_4_ * 0.00012207031 +
                             auVar137._0_4_ * 0.00012207031 * auVar27._0_4_;
              local_8a0[1] = local_c40._4_4_ * auVar26._4_4_ * 0.00012207031 +
                             local_c20._4_4_ * auVar31._4_4_ * 0.00012207031 +
                             auVar137._4_4_ * 0.00012207031 * auVar27._4_4_;
              local_8a0[2] = local_c40._8_4_ * auVar26._8_4_ * 0.00012207031 +
                             local_c20._8_4_ * auVar31._8_4_ * 0.00012207031 +
                             auVar137._8_4_ * 0.00012207031 * auVar27._8_4_;
              local_8a0[3] = local_c40._12_4_ * auVar26._12_4_ * 0.00012207031 +
                             local_c20._12_4_ * auVar31._12_4_ * 0.00012207031 +
                             auVar137._12_4_ * 0.00012207031 * auVar27._12_4_;
              fStack_890 = local_c40._16_4_ * auVar26._16_4_ * 0.00012207031 +
                           local_c20._16_4_ * auVar31._16_4_ * 0.00012207031 +
                           auVar137._16_4_ * 0.00012207031 * auVar27._16_4_;
              fStack_88c = local_c40._20_4_ * auVar26._20_4_ * 0.00012207031 +
                           local_c20._20_4_ * auVar31._20_4_ * 0.00012207031 +
                           auVar137._20_4_ * 0.00012207031 * auVar27._20_4_;
              fStack_888 = local_c40._24_4_ * auVar26._24_4_ * 0.00012207031 +
                           local_c20._24_4_ * auVar31._24_4_ * 0.00012207031 +
                           auVar137._24_4_ * 0.00012207031 * auVar27._24_4_;
              fStack_884 = auVar26._28_4_ + auVar31._28_4_ + auVar27._28_4_;
              auVar79 = vpacksswb_avx(auVar79,auVar79);
              bVar33 = SUB161(auVar79 >> 7,0) & 1 | (SUB161(auVar79 >> 0xf,0) & 1) << 1 |
                       (SUB161(auVar79 >> 0x17,0) & 1) << 2 | (SUB161(auVar79 >> 0x1f,0) & 1) << 3 |
                       (SUB161(auVar79 >> 0x27,0) & 1) << 4 | (SUB161(auVar79 >> 0x2f,0) & 1) << 5 |
                       (SUB161(auVar79 >> 0x37,0) & 1) << 6 | SUB161(auVar79 >> 0x3f,0) << 7;
              uVar67 = (ulong)bVar33;
              lVar65 = 0;
              if (uVar67 != 0) {
                for (; (bVar33 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
                }
              }
              local_bc0 = vpshufd_avx(ZEXT416(pGVar68->_geomID),0);
              auStack_bb0 = auVar120._16_16_;
              local_be0 = vpshufd_avx(ZEXT416(pGVar68->_primID),0);
              auStack_bd0 = auVar160._16_16_;
              auStack_b58 = auVar30._8_24_;
              local_b60 = pGVar71;
              local_960 = auVar157._0_8_;
              local_940 = local_a60._0_4_;
              fStack_93c = local_a60._4_4_;
              fStack_938 = local_a60._8_4_;
              fStack_934 = local_a60._12_4_;
              fStack_930 = local_a60._16_4_;
              fStack_92c = local_a60._20_4_;
              fStack_928 = local_a60._24_4_;
              fStack_924 = local_a60._28_4_;
              local_920 = auVar117._0_8_;
              while (uVar67 != 0) {
                local_ae0 = local_8a0[lVar65 + -8];
                fVar75 = local_8a0[lVar65];
                local_ad0._4_4_ = fVar75;
                local_ad0._0_4_ = fVar75;
                local_ad0._8_4_ = fVar75;
                local_ad0._12_4_ = fVar75;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_880 + lVar65 * 4);
                local_b90.context = context->user;
                local_b10 = *(undefined4 *)(local_860 + lVar65 * 4);
                uVar1 = *(undefined4 *)(local_840 + lVar65 * 4);
                local_b00._4_4_ = uVar1;
                local_b00._0_4_ = uVar1;
                local_b00._8_4_ = uVar1;
                local_b00._12_4_ = uVar1;
                local_c20._0_8_ = lVar65;
                uVar1 = *(undefined4 *)(local_820 + lVar65 * 4);
                local_af0._4_4_ = uVar1;
                local_af0._0_4_ = uVar1;
                local_af0._8_4_ = uVar1;
                local_af0._12_4_ = uVar1;
                local_ac0 = local_be0._0_8_;
                uStack_ab8 = local_be0._8_8_;
                local_ab0 = local_bc0;
                vcmpps_avx(ZEXT1632(local_bc0),ZEXT1632(local_bc0),0xf);
                uStack_a9c = (local_b90.context)->instID[0];
                local_aa0 = uStack_a9c;
                uStack_a98 = uStack_a9c;
                uStack_a94 = uStack_a9c;
                uStack_a90 = (local_b90.context)->instPrimID[0];
                uStack_a8c = uStack_a90;
                uStack_a88 = uStack_a90;
                uStack_a84 = uStack_a90;
                local_c00 = *local_bf0;
                local_b90.valid = (int *)local_c00;
                local_b90.geometryUserPtr = pGVar71->userPtr;
                local_b90.hit = (RTCHitN *)&local_b10;
                local_b90.N = 4;
                local_c40._0_8_ = uVar67;
                local_b90.ray = (RTCRayN *)ray;
                uStack_b0c = local_b10;
                uStack_b08 = local_b10;
                uStack_b04 = local_b10;
                fStack_adc = local_ae0;
                fStack_ad8 = local_ae0;
                fStack_ad4 = local_ae0;
                if (pGVar71->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar71->occlusionFilterN)(&local_b90);
                  uVar67 = local_c40._0_8_;
                  pGVar71 = local_b60;
                }
                if (local_c00 == (undefined1  [16])0x0) {
                  auVar117 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar117 = auVar117 ^ _DAT_01f46b70;
                }
                else {
                  p_Var7 = context->args->filter;
                  if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar71->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var7)(&local_b90);
                    uVar67 = local_c40._0_8_;
                    pGVar71 = local_b60;
                  }
                  auVar79 = vpcmpeqd_avx(local_c00,_DAT_01f45a50);
                  auVar117 = auVar79 ^ _DAT_01f46b70;
                  auVar103._8_4_ = 0xff800000;
                  auVar103._0_8_ = 0xff800000ff800000;
                  auVar103._12_4_ = 0xff800000;
                  auVar79 = vblendvps_avx(auVar103,*(undefined1 (*) [16])(local_b90.ray + 0x80),
                                          auVar79);
                  *(undefined1 (*) [16])(local_b90.ray + 0x80) = auVar79;
                }
                auVar90._8_8_ = 0x100000001;
                auVar90._0_8_ = 0x100000001;
                if ((auVar90 & auVar117) != (undefined1  [16])0x0) goto LAB_00f16081;
                *(int *)(ray + k * 4 + 0x80) = local_b40._0_4_;
                uVar67 = uVar67 ^ 1L << (local_c20._0_8_ & 0x3f);
                lVar65 = 0;
                if (uVar67 != 0) {
                  for (; (uVar67 >> lVar65 & 1) == 0; lVar65 = lVar65 + 1) {
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_00f152ec;
    }
    pGVar68 = (GridSOA *)(uVar67 & 0xfffffffffffffff0);
    uVar67 = *(ulong *)(pGVar68->data + pGVar68->rootOffset);
    (pre->super_Precalculations).grid = pGVar68;
    if (uVar67 != 0) {
      *local_d40 = uVar67;
      local_d40 = local_d40 + 1;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }